

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O2

int rfc5444_print_raw(autobuf *out,void *buffer,size_t length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  size_t *psVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t *ptr_00;
  ulong uVar10;
  uint8_t *ptr;
  ulong uVar11;
  size_t length_00;
  long lVar12;
  bool bVar13;
  size_t idx2;
  ulong uStack_c0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  size_t *local_88;
  ulong local_80;
  uint8_t *local_78;
  ulong local_70;
  size_t local_68;
  size_t local_60;
  ulong local_58;
  size_t local_50;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (length == 0) {
    return -1;
  }
  abuf_puts(out,"\t,------------------\n");
  abuf_puts(out,"\t|  PACKET\n");
  abuf_puts(out,"\t|------------------\n");
  bVar1 = *buffer;
  abuf_appendf(out,"\t| Packet version:    %u\n",(ulong)(bVar1 >> 4));
  abuf_appendf(out,"\t| Packet flags:      0x%02x\n",(ulong)(bVar1 & 0xf));
  local_68 = 1;
  if ((bVar1 & 8) == 0) {
    uStack_c0 = 1;
  }
  else {
    if (length < 3) {
      return -1;
    }
    abuf_appendf(out,"\t| Packet seq number: %u\n",(ulong)(ushort)(*buffer << 8 | *buffer >> 8));
    local_68 = 3;
    uStack_c0 = 3;
  }
  if (((bVar1 & 4) == 0) ||
     ((uStack_c0 + 2 <= length &&
      (iVar5 = _print_raw_tlvblock(out,"\t|    | ",(uint8_t *)buffer,&local_68,length),
      uStack_c0 = local_68, iVar5 == 0)))) {
    local_88 = (size_t *)((long)buffer + length);
    local_60 = length;
    while( true ) {
      if (length <= uStack_c0) {
        return 0;
      }
      local_98 = uStack_c0 + 4;
      if (length < local_98) break;
      abuf_puts(out,"\t|    ,-------------------\n");
      abuf_puts(out,"\t|    |  MESSAGE\n");
      abuf_puts(out,"\t|    |-------------------\n");
      abuf_appendf(out,"\t|    | Message type:       %u\n",
                   (ulong)*(byte *)((long)buffer + uStack_c0));
      bVar1 = *(byte *)((long)buffer + uStack_c0 + 1);
      abuf_appendf(out,"\t|    | Message flags:      0x%02x\n",(ulong)(bVar1 >> 4));
      length_00 = (ulong)(bVar1 & 0xf) + 1;
      abuf_appendf(out,"\t|    | Address length:     %u\n",length_00);
      uVar4 = *(ushort *)((long)buffer + uStack_c0 + 2);
      uVar10 = (ulong)(ushort)(uVar4 << 8 | uVar4 >> 8);
      abuf_appendf(out,"\t|    | Size:             %u\n",uVar10);
      uVar11 = local_98;
      local_a8 = local_98;
      local_90 = uVar10;
      local_80 = (ulong)bVar1;
      local_50 = length_00;
      if ((char)bVar1 < '\0') {
        uVar9 = local_98 + length_00;
        if (uStack_c0 + uVar10 < uVar9) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Originator address: ");
        _print_hex(out,(uint8_t *)(uVar11 + (long)buffer),length_00,(uint8_t *)local_88);
        local_a8 = uVar9;
      }
      length = local_60;
      uVar11 = local_80;
      if ((local_80 & 0x40) != 0) {
        uVar10 = local_a8 + 1;
        if (local_90 + uStack_c0 < uVar10) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Hop limit:          %u\n",
                     (ulong)*(byte *)((long)buffer + local_a8));
        local_a8 = uVar10;
      }
      if ((uVar11 & 0x20) != 0) {
        uVar10 = local_a8 + 1;
        if (local_90 + uStack_c0 < uVar10) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Hop count:          %u\n",
                     (ulong)*(byte *)((long)buffer + local_a8));
        local_a8 = uVar10;
      }
      if ((uVar11 & 0x10) != 0) {
        uVar11 = local_a8 + 2;
        if (local_90 + uStack_c0 < uVar11) {
          return -1;
        }
        abuf_appendf(out,"\t|    | Sequence Number:    %u\n",
                     (ulong)(ushort)(*(ushort *)((long)buffer + local_a8) << 8 |
                                    *(ushort *)((long)buffer + local_a8) >> 8));
        local_a8 = uVar11;
      }
      uVar11 = local_90;
      psVar7 = &local_a8;
      iVar5 = _print_raw_tlvblock(out,"\t|    |    ",(uint8_t *)buffer,psVar7,local_90);
      if (iVar5 != 0) {
        return -1;
      }
      local_a0 = uVar11 + uStack_c0;
      local_58 = uStack_c0;
      while (uVar11 = local_a8, local_a8 < local_a0) {
        uVar10 = local_a8 + 2;
        if (local_a0 < uVar10) {
          return -1;
        }
        abuf_puts(out,"\t|    |    ,-------------------\n");
        abuf_puts(out,"\t|    |    |  ADDRESS-BLOCK\n");
        abuf_puts(out,"\t|    |    |-------------------\n");
        bVar1 = *(byte *)((long)buffer + uVar11);
        uVar9 = (ulong)bVar1;
        local_80 = 0;
        abuf_appendf(out,"\t|    |    | Num-Addr: %u\n",uVar9);
        bVar2 = *(byte *)((long)buffer + uVar11 + 1);
        uVar8 = (ulong)bVar2;
        abuf_appendf(out,"\t|    |    | Flags:    0x%02x\n",uVar8);
        if ((char)bVar2 < '\0') {
          local_a8 = uVar11 + 3;
          if (local_a0 < local_a8) {
            return -1;
          }
          bVar3 = *(byte *)((long)buffer + uVar10);
          local_80 = CONCAT71((int7)((ulong)psVar7 >> 8),bVar3);
          uVar10 = bVar3 + local_a8;
          if (local_a0 < uVar10) {
            return -1;
          }
          ptr_00 = (uint8_t *)(local_a8 + (long)buffer);
          abuf_appendf(out,"\t|    |    | Head:     ");
          psVar7 = local_88;
          _print_hex(out,ptr_00,(ulong)bVar3,(uint8_t *)local_88);
          abuf_puts(out,"\n");
        }
        else {
          ptr_00 = (uint8_t *)0x0;
        }
        local_98 = uVar8;
        if ((bVar2 & 0x40) == 0) {
          local_78 = (uint8_t *)0x0;
          uVar11 = 0;
        }
        else {
          uVar11 = uVar10 + 1;
          if (local_a0 < uVar11) {
            return -1;
          }
          bVar2 = *(byte *)((long)buffer + uVar10);
          local_70 = CONCAT71((int7)((ulong)psVar7 >> 8),bVar2);
          uVar10 = uVar11 + bVar2;
          if (local_a0 < uVar10) {
            return -1;
          }
          abuf_appendf(out,"\t|    |    | Tail:     ");
          local_78 = (uint8_t *)(uVar11 + (long)buffer);
          _print_hex(out,(uint8_t *)(uVar11 + (long)buffer),(ulong)bVar2,(uint8_t *)local_88);
          abuf_puts(out,"\n");
          uVar11 = local_70;
        }
        if ((local_98 & 0x20) != 0) {
          if (local_a0 < uVar10 + 1) {
            return -1;
          }
          bVar2 = *(byte *)((long)buffer + uVar10);
          uVar11 = CONCAT71((int7)(uVar10 >> 8),bVar2);
          abuf_appendf(out,"\t|    |    | ZeroTail: ");
          _print_hex(out,rfc5444_print_raw::ZEROTAIL,(ulong)bVar2,(uint8_t *)local_88);
          abuf_puts(out,"\n");
          local_78 = rfc5444_print_raw::ZEROTAIL;
          uVar10 = uVar10 + 1;
        }
        local_38 = local_80 & 0xff;
        local_40 = uVar11 & 0xff;
        uVar6 = (int)local_40 + (uint)(byte)local_80;
        iVar5 = (uint)local_50 - uVar6;
        if ((uint)local_50 < uVar6 || iVar5 == 0) {
          return -1;
        }
        uVar8 = (ulong)(iVar5 * (uint)bVar1 & 0xffff);
        if (local_a0 < uVar8 + uVar10) {
          return -1;
        }
        lVar12 = uVar8 + local_58;
        if ((local_98 & 0x10) == 0) {
          if ((local_98 & 8) != 0) {
            uVar8 = uVar9 + lVar12;
            goto LAB_001325f9;
          }
          lVar12 = 0;
        }
        else {
          uVar8 = lVar12 + 1;
LAB_001325f9:
          if (local_a0 < uVar8) {
            return -1;
          }
        }
        local_98 = (ulong)((uint)(local_98 >> 3) & 1);
        local_70 = uVar11;
        local_48 = ptr_00;
        while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
          abuf_puts(out,"\t|    |    |    ,-------------------\n");
          abuf_puts(out,"\t|    |    |    |  Address\n");
          abuf_puts(out,"\t|    |    |    |-------------------\n");
          abuf_appendf(out,"\t|    |    |    | Address: ");
          psVar7 = local_88;
          if ((byte)local_80 != '\0') {
            _print_hex(out,local_48,local_38,(uint8_t *)local_88);
            abuf_puts(out," | ");
          }
          _print_hex(out,(uint8_t *)((long)buffer + uVar10),(long)iVar5,(uint8_t *)psVar7);
          if ((char)local_70 != '\0') {
            abuf_puts(out," | ");
            _print_hex(out,local_78,local_40,(uint8_t *)psVar7);
          }
          if (lVar12 != 0) {
            abuf_appendf(out," / %u",(ulong)*(byte *)((long)buffer + lVar12));
          }
          uVar10 = uVar10 + (long)iVar5;
          lVar12 = lVar12 + local_98;
          abuf_puts(out,"\n");
        }
        psVar7 = &local_a8;
        local_a8 = uVar10;
        iVar5 = _print_raw_tlvblock(out,"\t|    |    |    ",(uint8_t *)buffer,psVar7,local_90);
        length = local_60;
        if (iVar5 != 0) {
          return -1;
        }
      }
      uStack_c0 = local_a0;
      if (local_a8 != local_a0) {
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

int
rfc5444_print_raw(struct autobuf *out, void *buffer, size_t length) {
  static uint8_t ZEROTAIL[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
  uint8_t *ptr, *end;
  size_t idx, idx2, prefix_idx, i;
  uint8_t flags, head_len, tail_len, *head, *tail, num_addr;
  uint16_t msg_size, addr_length, mid_len;

  ptr = buffer;
  idx = 0;
  end = &ptr[length];
  
  if (idx + 1 > length) {
    return -1;
  }

  abuf_puts(out, "\t,------------------\n");
  abuf_puts(out, "\t|  PACKET\n");
  abuf_puts(out, "\t|------------------\n");

  flags = ptr[0];
  abuf_appendf(out, "\t| Packet version:    %u\n", flags >> 4);
  abuf_appendf(out, "\t| Packet flags:      0x%02x\n", flags & 0x0f);
  idx++;

  if (flags & RFC5444_PKT_FLAG_SEQNO) {
    if (idx + 2 > length) {
      return -1;
    }

    abuf_appendf(out, "\t| Packet seq number: %u\n", (ptr[0] << 8) | ptr[1]);
    idx += 2;
  }

  if (flags & RFC5444_PKT_FLAG_TLV) {
    if (idx + 2 > length) {
      return -1;
    }
    if (_print_raw_tlvblock(out, "\t|    | ", ptr, &idx, length)) {
      return -1;
    }
  }

  while (idx < length) {
    idx2 = idx;

    /* print messages */
    if (idx2 + 4 > length) {
      return -1;
    }

    abuf_puts(out, "\t|    ,-------------------\n");
    abuf_puts(out, "\t|    |  MESSAGE\n");
    abuf_puts(out, "\t|    |-------------------\n");
    abuf_appendf(out, "\t|    | Message type:       %u\n", ptr[idx]);

    flags = ptr[idx2 + 1];
    abuf_appendf(out, "\t|    | Message flags:      0x%02x\n", flags >> 4);

    addr_length = (flags & 15) + 1;
    abuf_appendf(out, "\t|    | Address length:     %u\n", addr_length);

    msg_size = (ptr[idx2 + 2] << 8) + ptr[idx + 3];
    abuf_appendf(out, "\t|    | Size:             %u\n", msg_size);
    idx2 += 4;

    if (flags & RFC5444_MSG_FLAG_ORIGINATOR) {
      if (idx2 + addr_length > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Originator address: ");
      _print_hex(out, &ptr[idx2], addr_length, end);
      idx2 += addr_length;
    }
    if (flags & RFC5444_MSG_FLAG_HOPLIMIT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop limit:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_HOPCOUNT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop count:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_SEQNO) {
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Sequence Number:    %u\n", (ptr[idx2] << 8) | ptr[idx2 + 1]);
      idx2 += 2;
    }

    if (_print_raw_tlvblock(out, "\t|    |    ", ptr, &idx2, msg_size)) {
      return -1;
    }

    while (idx2 < idx + msg_size) {
      /* print address blocks */
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }

      abuf_puts(out, "\t|    |    ,-------------------\n");
      abuf_puts(out, "\t|    |    |  ADDRESS-BLOCK\n");
      abuf_puts(out, "\t|    |    |-------------------\n");

      num_addr = ptr[idx2];
      abuf_appendf(out, "\t|    |    | Num-Addr: %u\n", num_addr);

      flags = ptr[idx2 + 1];
      abuf_appendf(out, "\t|    |    | Flags:    0x%02x\n", flags);

      idx2 += 2;

      head_len = tail_len = 0;
      head = NULL;
      tail = NULL;
      if (flags & RFC5444_ADDR_FLAG_HEAD) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        head_len = ptr[idx2];
        idx2++;
        if (idx2 + head_len > idx + msg_size) {
          return -1;
        }

        head = &ptr[idx2];

        abuf_appendf(out, "\t|    |    | Head:     ");
        _print_hex(out, head, head_len, end);
        abuf_puts(out, "\n");

        idx2 += head_len;
      }
      if (flags & RFC5444_ADDR_FLAG_FULLTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];
        idx2++;
        if (idx2 + tail_len > idx + msg_size) {
          return -1;
        }

        tail = &ptr[idx2];
        abuf_appendf(out, "\t|    |    | Tail:     ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");
        idx2 += tail_len;
      }
      if (flags & RFC5444_ADDR_FLAG_ZEROTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];

        tail = ZEROTAIL;
        abuf_appendf(out, "\t|    |    | ZeroTail: ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");

        idx2++;
      }

      if (head_len + tail_len >= addr_length) {
        return -1;
      }

      mid_len = (addr_length - head_len - tail_len) * num_addr;
      if (idx2 + mid_len > idx + msg_size) {
        return -1;
      }

      prefix_idx = idx + mid_len;
      if (flags & RFC5444_ADDR_FLAG_SINGLEPLEN) {
        if (prefix_idx + 1 > idx + msg_size) {
          return -1;
        }
      }
      else if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
        if (prefix_idx + num_addr > idx + msg_size) {
          return -1;
        }
      }
      else {
        prefix_idx = 0;
      }

      for (i = 0; i < num_addr; i++) {
        abuf_puts(out, "\t|    |    |    ,-------------------\n");
        abuf_puts(out, "\t|    |    |    |  Address\n");
        abuf_puts(out, "\t|    |    |    |-------------------\n");

        abuf_appendf(out, "\t|    |    |    | Address: ");

        if (head_len) {
          _print_hex(out, head, head_len, end);

          abuf_puts(out, " | ");
        }
        _print_hex(out, &ptr[idx2], addr_length - head_len - tail_len, end);
        idx2 += addr_length - head_len - tail_len;

        if (tail_len) {
          abuf_puts(out, " | ");

          _print_hex(out, tail, tail_len, end);
        }

        if (prefix_idx) {
          abuf_appendf(out, " / %u", ptr[prefix_idx]);
        }
        if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
          prefix_idx++;
        }

        abuf_puts(out, "\n");
      }

      if (_print_raw_tlvblock(out, "\t|    |    |    ", ptr, &idx2, msg_size)) {
        return -1;
      }
    }

    if (idx + msg_size != idx2) {
      return -1;
    }

    idx = idx2;
  }

  return 0;
}